

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O2

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
ParseMessageSetWithDeepRecReverseOrder<proto2_unittest::TestAllTypes>::TestBody
          (ParseMessageSetWithDeepRecReverseOrder<proto2_unittest::TestAllTypes> *this)

{
  bool bVar1;
  MutableType this_00;
  TestMessageSet *this_01;
  int i;
  int iVar2;
  char *in_R9;
  string_view data_00;
  AssertHelper local_e0;
  Message local_d8;
  StringOutputStream output_stream;
  TestMessageSet message_set_1;
  string data;
  TestMessageSet message_set;
  
  data._M_dataplus._M_p = (pointer)&data.field_2;
  data._M_string_length = 0;
  data.field_2._M_local_buf[0] = '\0';
  this_01 = &message_set_1;
  proto2_wireformat_unittest::TestMessageSet::TestMessageSet(this_01);
  for (iVar2 = 0; iVar2 != 200; iVar2 = iVar2 + 1) {
    this_00 = proto2_wireformat_unittest::TestMessageSet::
              MutableExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestMessageSetExtension1>,(unsigned_char)11,false>
                        (this_01,(ExtensionIdentifier<proto2_wireformat_unittest::TestMessageSet,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestMessageSetExtension1>,_(unsigned_char)__v_,_false>
                                  *)proto2_unittest::TestMessageSetExtension1::message_set_extension
                        );
    (this_00->field_0)._impl_.i_ = iVar2;
    *(byte *)&this_00->field_0 = *(byte *)&this_00->field_0 | 4;
    this_01 = proto2_unittest::TestMessageSetExtension1::mutable_recursive(this_00);
  }
  proto2_wireformat_unittest::TestMessageSet::ByteSizeLong(&message_set_1);
  io::StringOutputStream::StringOutputStream(&output_stream,&data);
  io::CodedOutputStream::CodedOutputStream<google::protobuf::io::StringOutputStream,void>
            ((CodedOutputStream *)&message_set,&output_stream);
  WireFormatTest<proto2_unittest::TestAllTypes>::SerializeReverseOrder
            (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,&message_set_1,
             (CodedOutputStream *)&message_set);
  io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&message_set);
  proto2_wireformat_unittest::TestMessageSet::~TestMessageSet(&message_set_1);
  proto2_wireformat_unittest::TestMessageSet::TestMessageSet(&message_set);
  data_00._M_str = data._M_dataplus._M_p;
  data_00._M_len = data._M_string_length;
  bVar1 = MessageLite::ParseFromString((MessageLite *)&message_set,data_00);
  output_stream.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream._0_1_ = !bVar1;
  output_stream.target_ = (string *)0x0;
  if (bVar1) {
    testing::Message::Message(&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&message_set_1,(internal *)&output_stream,
               (AssertionResult *)"message_set.ParseFromString(data)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x315,(char *)message_set_1.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&message_set_1);
    if (local_d8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_d8.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&output_stream.target_);
  proto2_wireformat_unittest::TestMessageSet::~TestMessageSet(&message_set);
  std::__cxx11::string::~string((string *)&data);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, ParseMessageSetWithDeepRecReverseOrder) {
  std::string data;
  {
    typename TestFixture::TestMessageSet message_set;
    typename TestFixture::TestMessageSet* mset = &message_set;
    for (int i = 0; i < 200; i++) {
      auto m = mset->MutableExtension(
          TestFixture::TestMessageSetExtension1::message_set_extension);
      m->set_i(i);
      mset = m->mutable_recursive();
    }
    message_set.ByteSizeLong();
    // Serialize with reverse payload tag order
    io::StringOutputStream output_stream(&data);
    io::CodedOutputStream coded_output(&output_stream);
    this->SerializeReverseOrder(message_set, &coded_output);
  }
  typename TestFixture::TestMessageSet message_set;
  EXPECT_FALSE(message_set.ParseFromString(data));
}